

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyplayer.cpp
# Opt level: O3

void main_cold_3(void)

{
  SDL_LogCritical(7,"No valid input file");
  return;
}

Assistant:

static unsigned char* check_and_convert(unsigned char* tune, unsigned int* length)
{
    sdInit();

    if (tune[2] != 0 || tune[3] != 0)
    {
        SDL_LogCritical(SDL_LOG_CATEGORY_INPUT, "No valid input file");
        return NULL;
    }
    ssbase base;
    int version = CheckV2MVersion(tune, *length, base);
    if (version < 0)
    {
        SDL_LogCritical(SDL_LOG_CATEGORY_INPUT, "Failed to Check Version on input file");
        return NULL;
    }

    uint8_t* converted;
    int converted_length;
    ConvertV2M(tune, *length, &converted, &converted_length);
    *length = converted_length;
    free(tune);

    return converted;
}